

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
write_decimal<unsigned_long_long>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this,
          unsigned_long_long value)

{
  type pcVar1;
  char *pcVar2;
  char *local_38;
  char **local_30;
  type *it;
  uint num_digits;
  bool is_negative;
  main_type abs_value;
  unsigned_long_long value_local;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this_local;
  
  _num_digits = value;
  abs_value = value;
  value_local = (unsigned_long_long)this;
  it._7_1_ = internal::is_negative<unsigned_long_long>(value);
  if ((bool)it._7_1_) {
    _num_digits = -_num_digits;
  }
  it._0_4_ = internal::count_digits(_num_digits);
  pcVar1 = reserve(this,(ulong)(((it._7_1_ & 1) != 0) + (uint)it));
  local_30 = &local_38;
  local_38 = pcVar1;
  if ((it._7_1_ & 1) != 0) {
    local_38 = pcVar1 + 1;
    *pcVar1 = '-';
  }
  pcVar2 = internal::format_decimal<char*,unsigned_long>(local_38,_num_digits,(uint)it);
  *local_30 = pcVar2;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    unsigned num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + num_digits);
    if (is_negative)
      *it++ = '-';
    it = internal::format_decimal(it, abs_value, num_digits);
  }